

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int fits_get_section_range(char **ptr,long *secmin,long *secmax,long *incre,int *status)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  char *pcVar4;
  char **in_RCX;
  long *in_RDX;
  char **in_RSI;
  long *in_RDI;
  int *in_R8;
  char *tstbuff;
  char token [71];
  int isanumber;
  int slen;
  char local_88;
  char local_87;
  int in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  if (0 < *in_R8) {
    return *in_R8;
  }
  iVar1 = fits_get_token2(in_RSI,(char *)in_RDX,in_RCX,in_R8,
                          (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (iVar1 == 0) {
    strcpy(&local_88,"*");
  }
  else {
    sVar3 = strlen((char *)0x0);
    if (0x46 < sVar3) {
      ffpmsg((char *)0x115439);
      free((void *)0x0);
      *in_R8 = 0x7d;
      return *in_R8;
    }
    strcpy(&local_88,(char *)0x0);
    free((void *)0x0);
  }
  if (local_88 == '*') {
    *in_RSI = (char *)0x1;
    *in_RDX = 0;
  }
  else if ((local_88 == '-') && (local_87 == '*')) {
    *in_RSI = (char *)0x0;
    *in_RDX = 1;
  }
  else {
    if ((iVar1 == 0) || ((in_stack_ffffffffffffffc8 == 0 || (*(char *)*in_RDI != ':')))) {
      *in_R8 = 0x7d;
      return 0x7d;
    }
    pcVar4 = (char *)atol(&local_88);
    *in_RSI = pcVar4;
    *in_RDI = *in_RDI + 1;
    iVar1 = fits_get_token2(in_RSI,(char *)in_RDX,in_RCX,in_R8,
                            (int *)CONCAT44(iVar1,in_stack_ffffffffffffffc8));
    if ((iVar1 == 0) || (in_stack_ffffffffffffffc8 == 0)) {
      *in_R8 = 0x7d;
      return 0x7d;
    }
    sVar3 = strlen((char *)0x0);
    if (0x46 < sVar3) {
      ffpmsg((char *)0x1155c5);
      free((void *)0x0);
      *in_R8 = 0x7d;
      return *in_R8;
    }
    strcpy(&local_88,(char *)0x0);
    free((void *)0x0);
    lVar2 = atol(&local_88);
    *in_RDX = lVar2;
  }
  if (*(char *)*in_RDI == ':') {
    *in_RDI = *in_RDI + 1;
    iVar1 = fits_get_token2(in_RSI,(char *)in_RDX,in_RCX,in_R8,
                            (int *)CONCAT44(iVar1,in_stack_ffffffffffffffc8));
    if ((iVar1 == 0) || (in_stack_ffffffffffffffc8 == 0)) {
      *in_R8 = 0x7d;
      return 0x7d;
    }
    sVar3 = strlen((char *)0x0);
    if (0x46 < sVar3) {
      ffpmsg((char *)0x1156cd);
      free((void *)0x0);
      *in_R8 = 0x7d;
      return *in_R8;
    }
    strcpy(&local_88,(char *)0x0);
    free((void *)0x0);
    pcVar4 = (char *)atol(&local_88);
    *in_RCX = pcVar4;
  }
  else {
    *in_RCX = (char *)0x1;
  }
  if (*(char *)*in_RDI == ',') {
    *in_RDI = *in_RDI + 1;
  }
  while (*(char *)*in_RDI == ' ') {
    *in_RDI = *in_RDI + 1;
  }
  if ((((long)*in_RSI < 0) || (*in_RDX < 0)) || ((long)*in_RCX < 1)) {
    *in_R8 = 0x7d;
  }
  return *in_R8;
}

Assistant:

int fits_get_section_range(char **ptr, 
                   long *secmin,
                   long *secmax, 
                   long *incre,
                   int *status)
/*
   Parse the input image section specification string, returning 
   the  min, max and increment values.
   Typical string =   "1:512:2"  or "1:512"
*/
{
    int slen, isanumber;
    char token[FLEN_VALUE], *tstbuff=0;

    if (*status > 0)
        return(*status);

    slen = fits_get_token2(ptr, " ,:", &tstbuff, &isanumber, status); /* get 1st token */
    if (slen==0)
    {
       /* support [:2,:2] type syntax, where the leading * is implied */
       strcpy(token,"*");
    }
    else
    {
       if (strlen(tstbuff) > FLEN_VALUE-1)
       {
          ffpmsg("Error: image section string too long (fits_get_section_range)");
          free(tstbuff);
          *status = URL_PARSE_ERROR;
          return(*status);
       }
       strcpy(token, tstbuff);
       free(tstbuff);
       tstbuff=0;
    }

    if (*token == '*')  /* wild card means to use the whole range */
    {
       *secmin = 1;
       *secmax = 0;
    }
    else if (*token == '-' && *(token+1) == '*' )  /* invert the whole range */
    {
       *secmin = 0;
       *secmax = 1;
    }
    else
    {
      if (slen == 0 || !isanumber || **ptr != ':')
        return(*status = URL_PARSE_ERROR);   

      /* the token contains the min value */
      *secmin = atol(token);

      (*ptr)++;  /* skip the colon between the min and max values */
      slen = fits_get_token2(ptr, " ,:", &tstbuff, &isanumber, status); /* get token */
      if (slen == 0 || !isanumber)
      {
        if (tstbuff)
           free(tstbuff);
        return(*status = URL_PARSE_ERROR);  
      } 
      if (strlen(tstbuff) > FLEN_VALUE-1)
      {
         ffpmsg("Error: image section string too long (fits_get_section_range)");
         free(tstbuff);
         *status = URL_PARSE_ERROR;
         return(*status);
      }
      strcpy(token, tstbuff);
      free(tstbuff);
      tstbuff=0;

      /* the token contains the max value */
      *secmax = atol(token);
    }

    if (**ptr == ':')
    {
        (*ptr)++;  /* skip the colon between the max and incre values */
        slen = fits_get_token2(ptr, " ,", &tstbuff, &isanumber, status); /* get token */
        if (slen == 0 || !isanumber)
        {
            if (tstbuff)
               free(tstbuff);
            return(*status = URL_PARSE_ERROR); 
        }  
        if (strlen(tstbuff) > FLEN_VALUE-1)
        {
           ffpmsg("Error: image section string too long (fits_get_section_range)");
           free(tstbuff);
           *status = URL_PARSE_ERROR;
           return(*status);
        }
        strcpy(token, tstbuff);
        free(tstbuff);
        tstbuff=0;


        *incre = atol(token);
    }
    else
        *incre = 1;  /* default increment if none is supplied */

    if (**ptr == ',')
        (*ptr)++;

    while (**ptr == ' ')   /* skip any trailing blanks */
         (*ptr)++;

    if (*secmin < 0 || *secmax < 0 || *incre < 1)
        *status = URL_PARSE_ERROR;

    return(*status);
}